

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O3

RefPtr<wabt::interp::Trap> * __thiscall
wabt::interp::Store::
Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
          (RefPtr<wabt::interp::Trap> *__return_storage_ptr__,Store *this,Store *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> *args_2)

{
  pointer pcVar1;
  Trap *pTVar2;
  Ref ref;
  Trap *local_38;
  
  pTVar2 = (Trap *)operator_new(0x78);
  (pTVar2->super_Object).kind_ = Trap;
  *(undefined8 *)&(pTVar2->super_Object).finalizer_.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(pTVar2->super_Object).finalizer_.super__Function_base._M_functor + 8) = 0;
  (pTVar2->super_Object).finalizer_.super__Function_base._M_manager = (_Manager_type)0x0;
  (pTVar2->super_Object).finalizer_._M_invoker = (_Invoker_type)0x0;
  (pTVar2->super_Object).host_info_ = (void *)0x0;
  (pTVar2->super_Object).self_.index = 0;
  (pTVar2->super_Object)._vptr_Object = (_func_int **)&PTR__Trap_001e0990;
  (pTVar2->message_)._M_dataplus._M_p = (pointer)&(pTVar2->message_).field_2;
  pcVar1 = (args_1->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pTVar2->message_,pcVar1,pcVar1 + args_1->_M_string_length);
  std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::vector
            (&pTVar2->trace_,args_2);
  local_38 = pTVar2;
  ref.index = FreeList<wabt::interp::Object*>::New<wabt::interp::Trap*>
                        ((FreeList<wabt::interp::Object*> *)&this->objects_,&local_38);
  RefPtr<wabt::interp::Trap>::RefPtr(__return_storage_ptr__,this,ref);
  (__return_storage_ptr__->obj_->super_Object).self_.index = ref.index;
  return __return_storage_ptr__;
}

Assistant:

RefPtr<T> Store::Alloc(Args&&... args) {
  Ref ref{objects_.New(new T(std::forward<Args>(args)...))};
  RefPtr<T> ptr{*this, ref};
  ptr->self_ = ref;
  return ptr;
}